

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

Vec3fa __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::computeDirection(CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
                   *this,uint primID)

{
  float fVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  RefCount RVar7;
  ulong in_RDX;
  undefined4 in_register_00000034;
  Vec3fa *axis1;
  long lVar8;
  long lVar9;
  Vec3fa VVar10;
  
  plVar3 = *(long **)(CONCAT44(in_register_00000034,primID) + 0x188);
  uVar2 = *(uint *)(*(long *)(CONCAT44(in_register_00000034,primID) + 0x58) +
                   (in_RDX & 0xffffffff) * *(long *)(CONCAT44(in_register_00000034,primID) + 0x68));
  lVar4 = *plVar3;
  lVar8 = plVar3[2];
  lVar9 = (ulong)uVar2 * lVar8;
  lVar8 = (ulong)(uVar2 + 1) * lVar8;
  fVar1 = *(float *)(CONCAT44(in_register_00000034,primID) + 0x24c);
  auVar5 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar9),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar9))),0x30);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar8),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar8))),0x30);
  RVar7 = (RefCount)vsubps_avx(auVar6,auVar5);
  (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
  super_Geometry.super_RefCount = RVar7;
  VVar10.field_0._0_8_ = RVar7._vptr_RefCount;
  VVar10.field_0._8_8_ = auVar6._0_8_;
  return (Vec3fa)VVar10.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID) const
      {
        const Curve3ff c = getCurveScaledRadius(primID);
        const Vec3fa p0 = c.begin();
        const Vec3fa p3 = c.end();
        const Vec3fa axis1 = p3 - p0;
        return axis1;
      }